

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::TopLabelExpr
          (BinaryReaderIR *this,LabelNode **label,Expr **expr)

{
  pointer pLVar1;
  long lVar2;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if (lVar2 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    *label = (LabelNode *)((long)pLVar1 + lVar2 + -0x18);
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
    if ((ulong)((lVar2 >> 3) * -0x5555555555555555) < 2) {
      PrintError(this,"accessing stack depth: %u >= max: %zd",1);
      return (Result)Error;
    }
    lVar2 = *(long *)((long)pLVar1 + lVar2 + -0x28);
    if (*(long *)(lVar2 + 0x10) != 0) {
      *expr = *(Expr **)(lVar2 + 8);
      return (Result)Ok;
    }
    PrintError(this,"TopLabelExpr: parent label has empty expr list");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::GetLabelAt(LabelNode** label, Index depth) {
  if (depth >= label_stack_.size()) {
    PrintError("accessing stack depth: %" PRIindex " >= max: %" PRIzd, depth,
               label_stack_.size());
    return Result::Error;
  }

  *label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}